

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImVec2 p_max;
  ImGuiContext *pIVar4;
  bool is_open;
  bool bVar5;
  ImU32 fill_col;
  int iVar6;
  int idx;
  float fVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  ImVec2 p_min;
  ImVec2 pos;
  float text_offset_y;
  float fVar13;
  float fVar14;
  bool hovered;
  bool held;
  ImGuiID id_local;
  float local_100;
  char log_suffix [3];
  char local_f9;
  undefined1 local_f8 [16];
  ImVec2 text_pos;
  ImRect interact_bb;
  ImRect bb;
  char log_prefix [4];
  ImVec2 local_78;
  ImVec2 label_size;
  float local_48;
  float fStack_44;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  if (pIVar3->SkipItems != false) {
    return false;
  }
  fVar9 = 0.0;
  if ((flags & 2U) != 0) {
    fVar9 = (pIVar4->Style).FramePadding.y;
  }
  fVar1 = (pIVar4->Style).FramePadding.x;
  id_local = id;
  if (label_end == (char *)0x0) {
    label_end = FindRenderedTextEnd(label,(char *)0x0);
  }
  IVar11 = CalcTextSize(label,label_end,false,-1.0);
  fVar14 = (pIVar3->DC).CurrentLineHeight;
  local_f8 = ZEXT416((uint)(pIVar3->DC).CurrentLineTextBaseOffset);
  fVar7 = (pIVar4->Style).FramePadding.y;
  fVar10 = fVar7 + fVar7 + pIVar4->FontSize;
  fVar7 = (pIVar3->Pos).x;
  label_size = IVar11;
  IVar12 = GetContentRegionMax();
  local_48 = IVar11.x;
  fStack_44 = IVar11.y;
  bb.Min = (pIVar3->DC).CursorPos;
  if (fVar10 <= fVar14) {
    fVar14 = fVar10;
  }
  fStack_44 = fVar9 + fVar9 + fStack_44;
  uVar8 = -(uint)(fStack_44 <= fVar14);
  interact_bb.Min.y = (float)(uVar8 & (uint)fVar14 | ~uVar8 & (uint)fStack_44);
  fVar10 = interact_bb.Min.y + (pIVar3->DC).CursorPos.y;
  fVar14 = bb.Min.x;
  text_offset_y =
       (float)(~-(uint)((float)local_f8._0_4_ - fVar9 <= 0.0) &
              (uint)((float)local_f8._0_4_ - fVar9));
  bb.Max.x = IVar12.x + fVar7;
  fVar7 = bb.Min.y;
  if ((flags & 2U) == 0) {
    local_100 = 2.0;
  }
  else {
    fVar13 = (float)(int)((pIVar3->WindowPadding).x * 0.5) + -1.0;
    fVar14 = fVar14 - fVar13;
    bb.Min.y = fVar7;
    bb.Min.x = fVar14;
    bb.Max.x = bb.Max.x + fVar13;
    local_100 = 3.0;
  }
  local_f8 = ZEXT416((uint)pIVar4->FontSize);
  fVar13 = (float)(-(uint)(0.0 < local_48) & (uint)(fVar1 + fVar1 + local_48)) + pIVar4->FontSize;
  interact_bb.Min.x = fVar13;
  bb.Max.y = fVar10;
  ItemSize(&interact_bb.Min,text_offset_y);
  if ((flags & 2U) == 0) {
    fVar2 = (pIVar4->Style).ItemSpacing.x;
    interact_bb.Min.y = fVar7;
    interact_bb.Min.x = fVar14;
    interact_bb.Max.y = fVar10;
    interact_bb.Max.x = fVar2 + fVar2 + fVar13 + fVar14;
  }
  else {
    interact_bb.Max.y = bb.Max.y;
    interact_bb.Max.x = bb.Max.x;
    interact_bb.Min = bb.Min;
  }
  is_open = TreeNodeBehaviorIsOpen(id_local,flags);
  bVar5 = ItemAdd(&interact_bb,&id_local);
  if (!bVar5) {
    if (!is_open || (char)((flags & 8U) >> 3) != '\0') {
      return is_open;
    }
    TreePushRawID(0);
    return true;
  }
  local_f8._0_4_ = (float)local_f8._0_4_ + local_100 * fVar1;
  bVar5 = ButtonBehavior(&interact_bb,id_local,&hovered,&held,
                         (((uint)flags >> 6 & 2 | 0x10) & (flags << 0x19) >> 0x1f) +
                         (flags & 4U) * 0x100 + 0x200);
  if ((((uint)flags >> 8 & 1) == 0) && (bVar5)) {
    bVar5 = (flags & 0xc0U) == 0;
    if ((char)flags < '\0') {
      text_pos.y = interact_bb.Max.y;
      text_pos.x = interact_bb.Min.x + (float)local_f8._0_4_;
      bVar5 = IsMouseHoveringRect(&interact_bb.Min,&text_pos,true);
      bVar5 = bVar5 || (flags & 0xc0U) == 0;
    }
    if ((flags & 0x40U) == 0) {
      if (!bVar5) goto LAB_00122523;
    }
    else if (!bVar5 && (pIVar4->IO).MouseDoubleClicked[0] == false) goto LAB_00122523;
    is_open = !is_open;
    ImGuiStorage::SetInt((pIVar3->DC).StateStorage,id_local,(uint)is_open);
  }
LAB_00122523:
  if ((flags & 4U) != 0) {
    SetItemAllowOverlap();
  }
  iVar6 = ((held ^ 1U) & hovered) + 0x19;
  idx = 0x1b;
  if ((hovered & 1U) == 0) {
    idx = iVar6;
  }
  if (held == false) {
    idx = iVar6;
  }
  fill_col = GetColorU32(idx,1.0);
  local_78.y = fVar9 + text_offset_y + fVar7;
  text_pos.y = local_78.y;
  text_pos.x = (float)local_f8._0_4_ + fVar14;
  if ((flags & 2U) == 0) {
    local_78.x = (float)local_f8._0_4_ + fVar14;
    if (((flags & 1U) != 0) || (hovered != false)) {
      p_max.y = bb.Max.y;
      p_max.x = bb.Max.x;
      RenderFrame(bb.Min,p_max,fill_col,false,0.0);
    }
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        p_min.x = fVar1 + fVar14;
        p_min.y = pIVar4->FontSize * 0.15 + text_offset_y + fVar7;
        RenderCollapseTriangle(p_min,is_open,0.7,false);
      }
    }
    else {
      pos.x = (float)local_f8._0_4_ * 0.5 + fVar14;
      pos.y = pIVar4->FontSize * 0.5 + text_offset_y + fVar7;
      RenderBullet(pos);
    }
    if (pIVar4->LogEnabled == true) {
      LogRenderedText(&text_pos,">",(char *)0x0);
    }
    RenderText(local_78,label,label_end,false);
  }
  else {
    local_f8._8_8_ = 0;
    local_f8._0_4_ = bb.Min.x;
    local_f8._4_4_ = bb.Min.y;
    IVar11.y = bb.Max.y;
    IVar11.x = bb.Max.x;
    RenderFrame(bb.Min,IVar11,fill_col,true,(pIVar4->Style).FrameRounding);
    IVar12.x = (float)local_f8._0_4_ + fVar1 + 0.0;
    IVar12.y = text_offset_y + fVar7 + fVar9;
    RenderCollapseTriangle(IVar12,is_open,1.0,true);
    if (pIVar4->LogEnabled == true) {
      builtin_strncpy(log_prefix,"\n##",4);
      log_suffix[2] = '\0';
      log_suffix[0] = '#';
      log_suffix[1] = '#';
      LogRenderedText(&text_pos,log_prefix,log_prefix + 3);
      RenderTextClipped(&text_pos,&bb.Max,label,label_end,&label_size,9,(ImVec2 *)0x0,(ImVec2 *)0x0)
      ;
      LogRenderedText(&text_pos,log_suffix + 1,&local_f9);
    }
    else {
      RenderTextClipped(&text_pos,&bb.Max,label,label_end,&label_size,9,(ImVec2 *)0x0,(ImVec2 *)0x0)
      ;
    }
  }
  if (is_open == true && (char)((flags & 8U) >> 3) == '\0') {
    TreePushRawID(0);
  }
  return is_open;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = display_frame ? style.FramePadding : ImVec2(style.FramePadding.x, 0.0f);

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float text_base_offset_y = ImMax(0.0f, window->DC.CurrentLineTextBaseOffset - padding.y); // Latch before ItemSize changes it
    const float frame_height = ImMax(ImMin(window->DC.CurrentLineHeight, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect bb = ImRect(window->DC.CursorPos, ImVec2(window->Pos.x + GetContentRegionMax().x, window->DC.CursorPos.y + frame_height));
    if (display_frame)
    {
        // Framed header expand a little outside the default padding
        bb.Min.x -= (float)(int)(window->WindowPadding.x*0.5f) - 1;
        bb.Max.x += (float)(int)(window->WindowPadding.x*0.5f) - 1;
    }

    const float text_offset_x = (g.FontSize + (display_frame ? padding.x*3 : padding.x*2));   // Collapser arrow width + Spacing
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);   // Include collapser
    ItemSize(ImVec2(text_width, frame_height), text_base_offset_y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    // (Ideally we'd want to add a flag for the user to specify we want want the hit test to be done up to the right side of the content or not)
    const ImRect interact_bb = display_frame ? bb : ImRect(bb.Min.x, bb.Min.y, bb.Min.x + text_width + style.ItemSpacing.x*2, bb.Max.y);
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (!ItemAdd(interact_bb, &id))
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushRawID(id);
        return is_open;
    }

    // Flags that affects opening behavior:
    // - 0(default) ..................... single-click anywhere to open
    // - OpenOnDoubleClick .............. double-click anywhere to open
    // - OpenOnArrow .................... single-click on arrow to open
    // - OpenOnDoubleClick|OpenOnArrow .. single-click on arrow or double-click anywhere to open
    ImGuiButtonFlags button_flags = ImGuiButtonFlags_NoKeyModifiers | ((flags & ImGuiTreeNodeFlags_AllowOverlapMode) ? ImGuiButtonFlags_AllowOverlapMode : 0);
    if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnDoubleClick | ((flags & ImGuiTreeNodeFlags_OpenOnArrow) ? ImGuiButtonFlags_PressedOnClickRelease : 0);
    bool hovered, held, pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    if (pressed && !(flags & ImGuiTreeNodeFlags_Leaf))
    {
        bool toggled = !(flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick));
        if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
            toggled |= IsMouseHoveringRect(interact_bb.Min, ImVec2(interact_bb.Min.x + text_offset_x, interact_bb.Max.y));
        if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
            toggled |= g.IO.MouseDoubleClicked[0];
        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowOverlapMode)
        SetItemAllowOverlap();

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
    const ImVec2 text_pos = bb.Min + ImVec2(text_offset_x, padding.y + text_base_offset_y);
    if (display_frame)
    {
        // Framed type
        RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);
        RenderCollapseTriangle(bb.Min + padding + ImVec2(0.0f, text_base_offset_y), is_open, 1.0f, true);
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
            LogRenderedText(text_pos, log_suffix+1, log_suffix+3);
        }
        else
        {
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || (flags & ImGuiTreeNodeFlags_Selected))
            RenderFrame(bb.Min, bb.Max, col, false);

        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(bb.Min + ImVec2(text_offset_x * 0.5f, g.FontSize*0.50f + text_base_offset_y));
        else if (!(flags & ImGuiTreeNodeFlags_Leaf))
            RenderCollapseTriangle(bb.Min + ImVec2(padding.x, g.FontSize*0.15f + text_base_offset_y), is_open, 0.70f, false);
        if (g.LogEnabled)
            LogRenderedText(text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushRawID(id);
    return is_open;
}